

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O3

void test_dt_float(void)

{
  char cVar1;
  bool bVar2;
  XSValue_Data expValue;
  XSValue_Data expValue_00;
  XSValue_Data expValue_01;
  XSValue_Data expValue_02;
  XSValue_Data expValue_03;
  XSValue_Data expValue_04;
  XSValue_Data expValue_05;
  XSValue_Data expValue_06;
  XSValue_Data expValue_07;
  uint uVar3;
  char cVar4;
  bool bVar5;
  XSValue_Data *pXVar6;
  XSValue *pXVar7;
  wchar16 *pwVar8;
  char *pcVar9;
  long lVar10;
  uint uVar11;
  void *pvVar12;
  char *pcVar13;
  Status myStatus;
  Status myStatus_22;
  char lex_v_ran_iv_4_canrep [2];
  char lex_v_ran_iv_3_canrep [2];
  char lex_iv_2 [8];
  char lex_v_ran_iv_1_canrep [4];
  char lex_iv_1 [9];
  char lex_v_ran_iv_2_canrep [5];
  char data_canrep_4 [6];
  char data_canrep_5 [9];
  char data_canrep_2 [9];
  char data_canrep_3 [10];
  char data_canrep_1 [10];
  char lex_v_ran_iv_4 [17];
  char lex_v_ran_iv_3 [17];
  char lex_v_ran_iv_2 [17];
  char lex_v_ran_iv_1 [17];
  char data_rawstr_2 [8];
  char data_rawstr_5 [11];
  char data_rawstr_4 [11];
  char data_rawstr_3 [14];
  char lex_v_ran_v_4 [17];
  char lex_v_ran_v_3 [17];
  char lex_v_ran_v_2 [17];
  char lex_v_ran_v_1 [17];
  char lex_v_ran_v_0 [15];
  char data_rawstr_1 [16];
  StrX local_478;
  char *local_468;
  Status local_460;
  char local_45c [2];
  undefined2 local_45a;
  char local_458 [12];
  char local_44c [4];
  undefined8 local_448;
  undefined1 local_440;
  char local_438 [8];
  char local_430 [8];
  char local_428 [16];
  char local_418 [16];
  char local_408 [16];
  char local_3f8 [16];
  char local_3e8 [32];
  char local_3c8 [32];
  char local_3a8 [32];
  char local_388 [32];
  char local_368 [12];
  uint local_35c;
  char local_358 [16];
  char local_348 [16];
  char local_338 [16];
  char local_328 [32];
  char local_308 [32];
  char local_2e8 [32];
  char local_2c8 [32];
  char local_2a8 [16];
  char local_298 [16];
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  ulong local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 local_bc;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined8 uStack_8c;
  undefined8 local_84;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined8 uStack_54;
  undefined8 local_4c;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 uStack_38;
  
  builtin_strncpy(local_2a8,"  1234.e+10  \n",0xf);
  builtin_strncpy(local_2c8,"+3.402823466e+38",0x11);
  builtin_strncpy(local_2e8,"-3.402823466e+38",0x11);
  builtin_strncpy(local_308,"+1.175494351e-38",0x11);
  builtin_strncpy(local_328,"-1.175494351e-38",0x11);
  builtin_strncpy(local_388,"+3.402823466e+39",0x11);
  builtin_strncpy(local_3a8,"-3.402823466e+39",0x11);
  builtin_strncpy(local_3c8,"+1.175494351e-46",0x11);
  builtin_strncpy(local_3e8,"-1.175494351e-46",0x11);
  builtin_strncpy(local_44c,"INF",4);
  builtin_strncpy(local_438,"-INF",5);
  local_45a = 0x30;
  local_45c[0] = '0';
  local_45c[1] = '\0';
  local_440 = 0;
  local_448 = 0x30312b652e783231;
  builtin_strncpy(local_458,"12.e+1x",8);
  builtin_strncpy(local_298,"   -123.45    \n",0x10);
  builtin_strncpy(local_3f8,"-1.2345E2",10);
  builtin_strncpy(local_368,"+123.45",8);
  builtin_strncpy(local_418,"1.2345E2",9);
  builtin_strncpy(local_338 + 8,"+0012",6);
  builtin_strncpy(local_338,"+123.45e",8);
  builtin_strncpy(local_408,"1.2345E14",10);
  builtin_strncpy(local_348,"+100.000e2",0xb);
  builtin_strncpy(local_430,"1.0E4",6);
  builtin_strncpy(local_358,"00100.23e2",0xb);
  builtin_strncpy(local_428,"1.0023E4",9);
  local_468 = (char *)((ulong)local_468 & 0xffffffff00000000);
  local_478.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_2a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_478.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_2a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar4 = xercesc_4_0::XSValue::validate
                    (local_478.fUnicodeForm,dt_float,(Status *)&local_468,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_478);
  if (cVar4 == '\0') {
    StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3ea,local_2a8,local_478.fLocalForm,1);
    StrX::~StrX(&local_478);
    errSeen = 1;
  }
  local_468 = (char *)((ulong)local_468 & 0xffffffff00000000);
  local_478.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_2c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_478.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_2c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar4 = xercesc_4_0::XSValue::validate
                    (local_478.fUnicodeForm,dt_float,(Status *)&local_468,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_478);
  if (cVar4 == '\0') {
    StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3eb,local_2c8,local_478.fLocalForm,1);
    StrX::~StrX(&local_478);
    errSeen = 1;
  }
  local_468 = (char *)((ulong)local_468 & 0xffffffff00000000);
  local_478.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_2e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_478.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_2e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar4 = xercesc_4_0::XSValue::validate
                    (local_478.fUnicodeForm,dt_float,(Status *)&local_468,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_478);
  if (cVar4 == '\0') {
    StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3ec,local_2e8,local_478.fLocalForm,1);
    StrX::~StrX(&local_478);
    errSeen = 1;
  }
  local_468 = (char *)((ulong)local_468 & 0xffffffff00000000);
  local_478.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_308,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_478.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_308,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar4 = xercesc_4_0::XSValue::validate
                    (local_478.fUnicodeForm,dt_float,(Status *)&local_468,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_478);
  if (cVar4 == '\0') {
    StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3ed,local_308,local_478.fLocalForm,1);
    StrX::~StrX(&local_478);
    errSeen = 1;
  }
  local_468 = (char *)((ulong)local_468 & 0xffffffff00000000);
  local_478.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_328,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_478.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_328,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar4 = xercesc_4_0::XSValue::validate
                    (local_478.fUnicodeForm,dt_float,(Status *)&local_468,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_478);
  if (cVar4 == '\0') {
    StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3ee,local_328,local_478.fLocalForm,1);
    StrX::~StrX(&local_478);
    errSeen = 1;
  }
  local_468 = (char *)((ulong)local_468 & 0xffffffff00000000);
  local_478.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_388,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_478.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_388,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar4 = xercesc_4_0::XSValue::validate
                    (local_478.fUnicodeForm,dt_float,(Status *)&local_468,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_478);
  if (cVar4 == '\0') {
    StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3f1,local_388,local_478.fLocalForm,1);
    StrX::~StrX(&local_478);
    errSeen = 1;
  }
  local_468 = (char *)((ulong)local_468 & 0xffffffff00000000);
  local_478.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_3a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_478.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_3a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar4 = xercesc_4_0::XSValue::validate
                    (local_478.fUnicodeForm,dt_float,(Status *)&local_468,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_478);
  if (cVar4 == '\0') {
    StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3f2,local_3a8,local_478.fLocalForm,1);
    StrX::~StrX(&local_478);
    errSeen = 1;
  }
  local_468 = (char *)((ulong)local_468 & 0xffffffff00000000);
  local_478.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_3c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_478.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_3c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar4 = xercesc_4_0::XSValue::validate
                    (local_478.fUnicodeForm,dt_float,(Status *)&local_468,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_478);
  if (cVar4 == '\0') {
    StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3f3,local_3c8,local_478.fLocalForm,1);
    StrX::~StrX(&local_478);
    errSeen = 1;
  }
  local_468 = (char *)((ulong)local_468 & 0xffffffff00000000);
  local_478.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_3e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_478.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_3e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar4 = xercesc_4_0::XSValue::validate
                    (local_478.fUnicodeForm,dt_float,(Status *)&local_468,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_478);
  if (cVar4 == '\0') {
    StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3f4,local_3e8,local_478.fLocalForm,1);
    StrX::~StrX(&local_478);
    errSeen = 1;
  }
  local_468 = (char *)((ulong)local_468 & 0xffffffff00000000);
  local_478.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         ((char *)&local_448,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_478.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ((char *)&local_448,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar4 = xercesc_4_0::XSValue::validate
                    (local_478.fUnicodeForm,dt_float,(Status *)&local_468,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_478);
  if (cVar4 == '\0') {
    if ((int)local_468 != 6) {
      StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      if (((ulong)local_468 & 0xffffffff) < 0xb) {
        pcVar13 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_468 & 0xffffffff];
      }
      else {
        pcVar13 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x3f7,&local_448,local_478.fLocalForm,"st_FOCA0002",pcVar13);
      goto LAB_001060ef;
    }
  }
  else {
    StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3f7,&local_448,local_478.fLocalForm,0);
LAB_001060ef:
    StrX::~StrX(&local_478);
    errSeen = 1;
  }
  local_468 = (char *)((ulong)local_468 & 0xffffffff00000000);
  local_478.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_458,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_478.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_458,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar4 = xercesc_4_0::XSValue::validate
                    (local_478.fUnicodeForm,dt_float,(Status *)&local_468,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_478);
  if (cVar4 == '\0') {
    if ((int)local_468 == 6) goto LAB_001061f8;
    StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    if (((ulong)local_468 & 0xffffffff) < 0xb) {
      pcVar13 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_468 & 0xffffffff];
    }
    else {
      pcVar13 = "st_UnknownType";
    }
    printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x3f8,local_458,local_478.fLocalForm,"st_FOCA0002",pcVar13);
  }
  else {
    StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x3f8,local_458,local_478.fLocalForm,0);
  }
  StrX::~StrX(&local_478);
  errSeen = 1;
LAB_001061f8:
  bVar5 = true;
  do {
    bVar2 = bVar5;
    local_468 = (char *)((ulong)local_468 & 0xffffffff00000000);
    local_478.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_2a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_478.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_2a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar12 = (void *)0x3;
    pXVar6 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_478.fUnicodeForm,dt_float,(Status *)&local_468,ver_10,bVar2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_478);
    if (pXVar6 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x416,local_2a8);
      StrX::~StrX(&local_478);
      errSeen = 1;
    }
    else {
      uStack_140 = 0x55339215;
      uStack_128 = uStack_38;
      uStack_13c = (undefined4)local_4c;
      uStack_138 = (undefined4)((ulong)local_4c >> 0x20);
      expValue.fValue.f_datetime.f_month = uStack_13c;
      expValue.fValue.f_int = 0x55339215;
      expValue.fValue.f_datetime.f_hour = uStack_44;
      expValue.fValue.f_datetime.f_day = uStack_138;
      expValue.fValue.f_datetime.f_second = uStack_3c;
      expValue.fValue.f_datetime.f_min = uStack_40;
      expValue._0_8_ = local_148;
      expValue.fValue.f_datetime.f_milisec = (double)uStack_38;
      bVar5 = compareActualValue(dt_float,*pXVar6,expValue);
      if (!bVar5) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar12);
    }
    local_468 = (char *)((ulong)local_468 & 0xffffffff00000000);
    local_478.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_2c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_478.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_2c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar12 = (void *)0x3;
    pXVar6 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_478.fUnicodeForm,dt_float,(Status *)&local_468,ver_10,bVar2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_478);
    if (pXVar6 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x417,local_2c8);
      StrX::~StrX(&local_478);
      errSeen = 1;
    }
    else {
      uStack_168 = 0x7f7fffff;
      uStack_150 = uStack_54;
      uStack_164 = (undefined4)local_68;
      uStack_160 = (undefined4)((ulong)local_68 >> 0x20);
      expValue_00.fValue.f_datetime.f_month = uStack_164;
      expValue_00.fValue.f_int = 0x7f7fffff;
      expValue_00.fValue.f_datetime.f_hour = uStack_60;
      expValue_00.fValue.f_datetime.f_day = uStack_160;
      expValue_00.fValue.f_datetime.f_second = uStack_58;
      expValue_00.fValue.f_datetime.f_min = uStack_5c;
      expValue_00._0_8_ = local_170;
      expValue_00.fValue.f_datetime.f_milisec = (double)uStack_54;
      bVar5 = compareActualValue(dt_float,*pXVar6,expValue_00);
      if (!bVar5) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar12);
    }
    local_468 = (char *)((ulong)local_468 & 0xffffffff00000000);
    local_478.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_2e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_478.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_2e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar12 = (void *)0x3;
    pXVar6 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_478.fUnicodeForm,dt_float,(Status *)&local_468,ver_10,bVar2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_478);
    if (pXVar6 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x418,local_2e8);
      StrX::~StrX(&local_478);
      errSeen = 1;
    }
    else {
      uStack_190 = 0xff7fffff;
      uStack_178 = uStack_70;
      uStack_18c = (undefined4)local_84;
      uStack_188 = (undefined4)((ulong)local_84 >> 0x20);
      expValue_01.fValue.f_datetime.f_month = uStack_18c;
      expValue_01.fValue.f_int = 0xff7fffff;
      expValue_01.fValue.f_datetime.f_hour = uStack_7c;
      expValue_01.fValue.f_datetime.f_day = uStack_188;
      expValue_01.fValue.f_datetime.f_second = uStack_74;
      expValue_01.fValue.f_datetime.f_min = uStack_78;
      expValue_01._0_8_ = local_198;
      expValue_01.fValue.f_datetime.f_milisec = (double)uStack_70;
      bVar5 = compareActualValue(dt_float,*pXVar6,expValue_01);
      if (!bVar5) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar12);
    }
    local_468 = (char *)((ulong)local_468 & 0xffffffff00000000);
    local_478.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_308,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_478.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_308,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar12 = (void *)0x3;
    pXVar6 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_478.fUnicodeForm,dt_float,(Status *)&local_468,ver_10,bVar2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_478);
    if (pXVar6 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x419,local_308);
      StrX::~StrX(&local_478);
      errSeen = 1;
    }
    else {
      uStack_1b8 = 0x800000;
      uStack_1a0 = uStack_8c;
      uStack_1b4 = (undefined4)local_a0;
      uStack_1b0 = (undefined4)((ulong)local_a0 >> 0x20);
      expValue_02.fValue.f_datetime.f_month = uStack_1b4;
      expValue_02.fValue.f_int = 0x800000;
      expValue_02.fValue.f_datetime.f_hour = uStack_98;
      expValue_02.fValue.f_datetime.f_day = uStack_1b0;
      expValue_02.fValue.f_datetime.f_second = uStack_90;
      expValue_02.fValue.f_datetime.f_min = uStack_94;
      expValue_02._0_8_ = local_1c0;
      expValue_02.fValue.f_datetime.f_milisec = (double)uStack_8c;
      bVar5 = compareActualValue(dt_float,*pXVar6,expValue_02);
      if (!bVar5) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar12);
    }
    local_468 = (char *)((ulong)local_468 & 0xffffffff00000000);
    local_478.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_328,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_478.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_328,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar12 = (void *)0x3;
    pXVar6 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_478.fUnicodeForm,dt_float,(Status *)&local_468,ver_10,bVar2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_478);
    if (pXVar6 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x41a,local_328);
      StrX::~StrX(&local_478);
      errSeen = 1;
    }
    else {
      uStack_1e0 = 0x80800000;
      uStack_1c8 = uStack_a8;
      uStack_1dc = (undefined4)local_bc;
      uStack_1d8 = (undefined4)((ulong)local_bc >> 0x20);
      expValue_03.fValue.f_datetime.f_month = uStack_1dc;
      expValue_03.fValue.f_float = -1.1754944e-38;
      expValue_03.fValue.f_datetime.f_hour = uStack_b4;
      expValue_03.fValue.f_datetime.f_day = uStack_1d8;
      expValue_03.fValue.f_datetime.f_second = uStack_ac;
      expValue_03.fValue.f_datetime.f_min = uStack_b0;
      expValue_03._0_8_ = local_1e8;
      expValue_03.fValue.f_datetime.f_milisec = (double)uStack_a8;
      bVar5 = compareActualValue(dt_float,*pXVar6,expValue_03);
      if (!bVar5) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar12);
    }
    local_468 = (char *)((ulong)local_468 & 0xffffffff00000000);
    local_478.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_388,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_478.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_388,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar12 = (void *)0x3;
    pXVar6 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_478.fUnicodeForm,dt_float,(Status *)&local_468,ver_10,bVar2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_478);
    if (pXVar6 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x41d,local_388);
      StrX::~StrX(&local_478);
      errSeen = 1;
    }
    else {
      uStack_208 = 0x100000000;
      local_1f0 = local_c8;
      local_200 = local_d8;
      uStack_1f8 = uStack_d0;
      expValue_04.fValue.f_long = 0x100000000;
      expValue_04._0_8_ = local_210;
      expValue_04.fValue._8_8_ = local_d8;
      expValue_04.fValue._16_8_ = uStack_d0;
      expValue_04.fValue.f_datetime.f_milisec = (double)local_c8;
      bVar5 = compareActualValue(dt_float,*pXVar6,expValue_04);
      if (!bVar5) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar12);
    }
    local_468 = (char *)((ulong)local_468 & 0xffffffff00000000);
    local_478.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_478.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar12 = (void *)0x3;
    pXVar6 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_478.fUnicodeForm,dt_float,(Status *)&local_468,ver_10,bVar2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_478);
    if (pXVar6 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x41e,local_3a8);
      StrX::~StrX(&local_478);
      errSeen = 1;
    }
    else {
      uStack_230 = 0;
      local_218 = local_e0;
      local_228 = local_f0;
      uStack_220 = uStack_e8;
      expValue_05.fValue.f_long = 0;
      expValue_05._0_8_ = local_238;
      expValue_05.fValue._8_8_ = local_f0;
      expValue_05.fValue._16_8_ = uStack_e8;
      expValue_05.fValue.f_datetime.f_milisec = (double)local_e0;
      bVar5 = compareActualValue(dt_float,*pXVar6,expValue_05);
      if (!bVar5) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar12);
    }
    local_468 = (char *)((ulong)local_468 & 0xffffffff00000000);
    local_478.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_478.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar12 = (void *)0x3;
    pXVar6 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_478.fUnicodeForm,dt_float,(Status *)&local_468,ver_10,bVar2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_478);
    if (pXVar6 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x41f,local_3c8);
      StrX::~StrX(&local_478);
      errSeen = 1;
    }
    else {
      uStack_258 = 0x300000000;
      local_240 = local_f8;
      local_250 = local_108;
      uStack_248 = uStack_100;
      expValue_06.fValue.f_long = 0x300000000;
      expValue_06._0_8_ = local_260;
      expValue_06.fValue._8_8_ = local_108;
      expValue_06.fValue._16_8_ = uStack_100;
      expValue_06.fValue.f_datetime.f_milisec = (double)local_f8;
      bVar5 = compareActualValue(dt_float,*pXVar6,expValue_06);
      if (!bVar5) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar12);
    }
    local_468 = (char *)((ulong)local_468 & 0xffffffff00000000);
    local_478.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_478.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar12 = (void *)0x3;
    pXVar6 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_478.fUnicodeForm,dt_float,(Status *)&local_468,ver_10,bVar2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_478);
    if (pXVar6 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x420,local_3e8);
      StrX::~StrX(&local_478);
      errSeen = 1;
    }
    else {
      uStack_280 = 0x300000000;
      local_268 = local_110;
      local_278 = local_120;
      uStack_270 = uStack_118;
      expValue_07.fValue.f_long = 0x300000000;
      expValue_07._0_8_ = local_288;
      expValue_07.fValue._8_8_ = local_120;
      expValue_07.fValue._16_8_ = uStack_118;
      expValue_07.fValue.f_datetime.f_milisec = (double)local_110;
      bVar5 = compareActualValue(dt_float,*pXVar6,expValue_07);
      if (!bVar5) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar6);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar6,pvVar12);
    }
    local_468 = (char *)((ulong)local_468 & 0xffffffff00000000);
    local_478.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_448,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_478.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_448,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar7 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_478.fUnicodeForm,dt_float,(Status *)&local_468,ver_10,bVar2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_478);
    if (pXVar7 == (XSValue *)0x0) {
      if ((int)local_468 != 6) {
        StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        pcVar13 = "st_UnknownType";
        if (((ulong)local_468 & 0xffffffff) < 0xb) {
          pcVar13 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_468 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x423,&local_448,local_478.fLocalForm,"st_FOCA0002",pcVar13);
        StrX::~StrX(&local_478);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      pvVar12 = (void *)0x423;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x423,&local_448);
      StrX::~StrX(&local_478);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar7);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar7,pvVar12);
    }
    local_468 = (char *)((ulong)local_468 & 0xffffffff00000000);
    local_478.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_458,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_478.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_458,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar7 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_478.fUnicodeForm,dt_float,(Status *)&local_468,ver_10,bVar2,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_478);
    if (pXVar7 == (XSValue *)0x0) {
      if ((int)local_468 != 6) {
        StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        pcVar13 = "st_UnknownType";
        if (((ulong)local_468 & 0xffffffff) < 0xb) {
          pcVar13 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_468 & 0xffffffff];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x424,local_458,local_478.fLocalForm,"st_FOCA0002",pcVar13);
        StrX::~StrX(&local_478);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      pvVar12 = (void *)0x424;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x424,local_458);
      StrX::~StrX(&local_478);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar7);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar7,pvVar12);
    }
    bVar5 = false;
  } while (bVar2);
  uVar11 = 1;
  do {
    local_460 = st_Init;
    local_478.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_298,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_478.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_298,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar5 = SUB41(uVar11,0);
    local_35c = uVar11;
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_478.fUnicodeForm,dt_float,&local_460,ver_10,bVar5,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_478);
    if (pwVar8 == (wchar16 *)0x0) {
      StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x444,local_298);
      StrX::~StrX(&local_478);
      errSeen = 1;
    }
    else {
      local_468 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_3f8;
      if (local_468 != pcVar13) {
        pcVar9 = local_468;
        if (local_468 == (char *)0x0) {
LAB_00106fe5:
          if (*pcVar13 == '\0') goto LAB_00107035;
        }
        else {
          do {
            cVar4 = *pcVar9;
            if (cVar4 == '\0') goto LAB_00106fe5;
            pcVar9 = pcVar9 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar4 == cVar1);
        }
        StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x444,local_298,local_478.fLocalForm,local_468,local_3f8);
        StrX::~StrX(&local_478);
        errSeen = 1;
      }
LAB_00107035:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar8);
      xercesc_4_0::XMLString::release(&local_468,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_460 = st_Init;
    local_478.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_368,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_478.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_368,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_478.fUnicodeForm,dt_float,&local_460,ver_10,bVar5,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_478);
    if (pwVar8 == (wchar16 *)0x0) {
      StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x445,local_368);
      StrX::~StrX(&local_478);
      errSeen = 1;
    }
    else {
      local_468 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_418;
      if (local_468 != pcVar13) {
        pcVar9 = local_468;
        if (local_468 == (char *)0x0) {
LAB_00107126:
          if (*pcVar13 == '\0') goto LAB_00107176;
        }
        else {
          do {
            cVar4 = *pcVar9;
            if (cVar4 == '\0') goto LAB_00107126;
            pcVar9 = pcVar9 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar4 == cVar1);
        }
        StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x445,local_368,local_478.fLocalForm,local_468,local_418);
        StrX::~StrX(&local_478);
        errSeen = 1;
      }
LAB_00107176:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar8);
      xercesc_4_0::XMLString::release(&local_468,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_460 = st_Init;
    local_478.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_338,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_478.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_338,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_478.fUnicodeForm,dt_float,&local_460,ver_10,bVar5,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_478);
    if (pwVar8 == (wchar16 *)0x0) {
      StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x446,local_338);
      StrX::~StrX(&local_478);
      errSeen = 1;
    }
    else {
      local_468 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_408;
      if (local_468 != pcVar13) {
        pcVar9 = local_468;
        if (local_468 == (char *)0x0) {
LAB_00107267:
          if (*pcVar13 == '\0') goto LAB_001072b7;
        }
        else {
          do {
            cVar4 = *pcVar9;
            if (cVar4 == '\0') goto LAB_00107267;
            pcVar9 = pcVar9 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar4 == cVar1);
        }
        StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x446,local_338,local_478.fLocalForm,local_468,local_408);
        StrX::~StrX(&local_478);
        errSeen = 1;
      }
LAB_001072b7:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar8);
      xercesc_4_0::XMLString::release(&local_468,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_460 = st_Init;
    local_478.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_348,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_478.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_348,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_478.fUnicodeForm,dt_float,&local_460,ver_10,bVar5,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_478);
    if (pwVar8 == (wchar16 *)0x0) {
      StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x447,local_348);
      StrX::~StrX(&local_478);
      errSeen = 1;
    }
    else {
      local_468 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_430;
      if (local_468 != pcVar13) {
        pcVar9 = local_468;
        if (local_468 == (char *)0x0) {
LAB_001073a8:
          if (*pcVar13 == '\0') goto LAB_001073f8;
        }
        else {
          do {
            cVar4 = *pcVar9;
            if (cVar4 == '\0') goto LAB_001073a8;
            pcVar9 = pcVar9 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar4 == cVar1);
        }
        StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x447,local_348,local_478.fLocalForm,local_468,local_430);
        StrX::~StrX(&local_478);
        errSeen = 1;
      }
LAB_001073f8:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar8);
      xercesc_4_0::XMLString::release(&local_468,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_460 = st_Init;
    local_478.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_358,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_478.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_358,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_478.fUnicodeForm,dt_float,&local_460,ver_10,bVar5,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_478);
    if (pwVar8 == (wchar16 *)0x0) {
      StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x448,local_358);
      StrX::~StrX(&local_478);
      errSeen = 1;
    }
    else {
      local_468 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_428;
      if (local_468 != pcVar13) {
        pcVar9 = local_468;
        if (local_468 == (char *)0x0) {
LAB_001074ec:
          if (*pcVar13 == '\0') goto LAB_0010753c;
        }
        else {
          do {
            cVar4 = *pcVar9;
            if (cVar4 == '\0') goto LAB_001074ec;
            pcVar9 = pcVar9 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar4 == cVar1);
        }
        StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x448,local_358,local_478.fLocalForm,local_468,local_428);
        StrX::~StrX(&local_478);
        errSeen = 1;
      }
LAB_0010753c:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar8);
      xercesc_4_0::XMLString::release(&local_468,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_468 = (char *)((ulong)local_468 & 0xffffffff00000000);
    local_478.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           ((char *)&local_448,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_478.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            ((char *)&local_448,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar10 = xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_478.fUnicodeForm,dt_float,(Status *)&local_468,ver_10,bVar5,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_478);
    if (lVar10 == 0) {
      if ((int)local_468 != 6) {
        StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        pcVar13 = "st_UnknownType";
        if (((ulong)local_468 & 0xffffffff) < 0xb) {
          pcVar13 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_468 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,1099,&local_448,local_478.fLocalForm,"st_FOCA0002",pcVar13);
        StrX::~StrX(&local_478);
        goto LAB_00107660;
      }
    }
    else {
      StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,1099,&local_448);
      StrX::~StrX(&local_478);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar10);
LAB_00107660:
      errSeen = 1;
    }
    local_468 = (char *)((ulong)local_468 & 0xffffffff00000000);
    local_478.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_458,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_478.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_458,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar10 = xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_478.fUnicodeForm,dt_float,(Status *)&local_468,ver_10,bVar5,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_478);
    if (lVar10 == 0) {
      if ((int)local_468 != 6) {
        StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        pcVar13 = "st_UnknownType";
        if (((ulong)local_468 & 0xffffffff) < 0xb) {
          pcVar13 = (&PTR_anon_var_dwarf_11d7_00140bc8)[(ulong)local_468 & 0xffffffff];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x44c,local_458,local_478.fLocalForm,"st_FOCA0002",pcVar13);
        StrX::~StrX(&local_478);
        goto LAB_00107760;
      }
    }
    else {
      StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x44c,local_458);
      StrX::~StrX(&local_478);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar10);
LAB_00107760:
      errSeen = 1;
    }
    local_460 = st_Init;
    local_478.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_388,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_478.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_388,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_478.fUnicodeForm,dt_float,&local_460,ver_10,bVar5,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_478);
    if (pwVar8 == (wchar16 *)0x0) {
      StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x44f,local_388);
      StrX::~StrX(&local_478);
      errSeen = 1;
    }
    else {
      local_468 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_44c;
      if (local_468 != pcVar13) {
        pcVar9 = local_468;
        if (local_468 == (char *)0x0) {
LAB_0010783e:
          if (*pcVar13 == '\0') goto LAB_0010788b;
        }
        else {
          do {
            cVar4 = *pcVar9;
            if (cVar4 == '\0') goto LAB_0010783e;
            pcVar9 = pcVar9 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar4 == cVar1);
        }
        StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x44f,local_388,local_478.fLocalForm,local_468,local_44c);
        StrX::~StrX(&local_478);
        errSeen = 1;
      }
LAB_0010788b:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar8);
      xercesc_4_0::XMLString::release(&local_468,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_460 = st_Init;
    local_478.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_478.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3a8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_478.fUnicodeForm,dt_float,&local_460,ver_10,bVar5,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_478);
    if (pwVar8 == (wchar16 *)0x0) {
      StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x450,local_3a8);
      StrX::~StrX(&local_478);
      errSeen = 1;
    }
    else {
      local_468 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_438;
      if (local_468 != pcVar13) {
        pcVar9 = local_468;
        if (local_468 == (char *)0x0) {
LAB_0010797e:
          if (*pcVar13 == '\0') goto LAB_001079ce;
        }
        else {
          do {
            cVar4 = *pcVar9;
            if (cVar4 == '\0') goto LAB_0010797e;
            pcVar9 = pcVar9 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar4 == cVar1);
        }
        StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x450,local_3a8,local_478.fLocalForm,local_468,local_438);
        StrX::~StrX(&local_478);
        errSeen = 1;
      }
LAB_001079ce:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar8);
      xercesc_4_0::XMLString::release(&local_468,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_460 = st_Init;
    local_478.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_478.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_478.fUnicodeForm,dt_float,&local_460,ver_10,bVar5,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_478);
    if (pwVar8 == (wchar16 *)0x0) {
      StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x451,local_3c8);
      StrX::~StrX(&local_478);
      errSeen = 1;
    }
    else {
      local_468 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = (char *)&local_45a;
      if (local_468 != pcVar13) {
        pcVar9 = local_468;
        if (local_468 == (char *)0x0) {
LAB_00107abe:
          if (*pcVar13 == '\0') goto LAB_00107b0b;
        }
        else {
          do {
            cVar4 = *pcVar9;
            if (cVar4 == '\0') goto LAB_00107abe;
            pcVar9 = pcVar9 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar4 == cVar1);
        }
        StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x451,local_3c8,local_478.fLocalForm,local_468,&local_45a);
        StrX::~StrX(&local_478);
        errSeen = 1;
      }
LAB_00107b0b:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar8);
      xercesc_4_0::XMLString::release(&local_468,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    local_460 = st_Init;
    local_478.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_3e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_478.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_3e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pwVar8 = (wchar16 *)
             xercesc_4_0::XSValue::getCanonicalRepresentation
                       (local_478.fUnicodeForm,dt_float,&local_460,ver_10,bVar5,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_478);
    uVar3 = local_35c;
    if (pwVar8 == (wchar16 *)0x0) {
      StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
      printf("CANREP_TEST No CanRep returned,                                                       at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x452,local_3e8);
      StrX::~StrX(&local_478);
      errSeen = 1;
    }
    else {
      local_468 = (char *)xercesc_4_0::XMLString::transcode
                                    (pwVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      pcVar13 = local_45c;
      if (local_468 != pcVar13) {
        pcVar9 = local_468;
        if (local_468 == (char *)0x0) {
LAB_00107c02:
          if (*pcVar13 == '\0') goto LAB_00107c4f;
        }
        else {
          do {
            cVar4 = *pcVar9;
            if (cVar4 == '\0') goto LAB_00107c02;
            pcVar9 = pcVar9 + 1;
            cVar1 = *pcVar13;
            pcVar13 = pcVar13 + 1;
          } while (cVar4 == cVar1);
        }
        StrX::StrX(&local_478,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_FLOAT);
        printf("CANREP_TEST CanRep Diff                                                         , at line <%d> data=<%s>, datatype=<%s>,                                                actCanRep=<%s>, toCompare=<%s>\n"
               ,0x452,local_3e8,local_478.fLocalForm,local_468,local_45c);
        StrX::~StrX(&local_478);
        errSeen = 1;
      }
LAB_00107c4f:
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,pwVar8);
      xercesc_4_0::XMLString::release(&local_468,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    }
    uVar11 = 0;
    if ((uVar3 & 1) == 0) {
      return;
    }
  } while( true );
}

Assistant:

void test_dt_float()
{

    const XSValue::DataType dt = XSValue::dt_float;
    bool  toValidate = true;

    const char lex_v_ran_v_0[]="  1234.e+10  \n";
    const char lex_v_ran_v_1[]="+3.402823466e+38";
    const char lex_v_ran_v_2[]="-3.402823466e+38";
    const char lex_v_ran_v_3[]="+1.175494351e-38";
    const char lex_v_ran_v_4[]="-1.175494351e-38";

    XSValue::XSValue_Data act_v_ran_v_0; act_v_ran_v_0.fValue.f_float = (float)1234.e+10;
    XSValue::XSValue_Data act_v_ran_v_1; act_v_ran_v_1.fValue.f_float = (float)+3.402823466e+38;
    XSValue::XSValue_Data act_v_ran_v_2; act_v_ran_v_2.fValue.f_float = (float)-3.402823466e+38;
    XSValue::XSValue_Data act_v_ran_v_3; act_v_ran_v_3.fValue.f_float = (float)+1.175494351e-38;
    XSValue::XSValue_Data act_v_ran_v_4; act_v_ran_v_4.fValue.f_float = (float)-1.175494351e-38;

    const char lex_v_ran_iv_1[]="+3.402823466e+39";
    const char lex_v_ran_iv_2[]="-3.402823466e+39";
    const char lex_v_ran_iv_3[]="+1.175494351e-46";
    const char lex_v_ran_iv_4[]="-1.175494351e-46";

    XSValue::XSValue_Data lex_iv_ran_v_1; lex_iv_ran_v_1.fValue.f_float = (float)0.0;
    lex_iv_ran_v_1.fValue.f_floatType.f_floatEnum = XSValue::DoubleFloatType_PosINF;
    XSValue::XSValue_Data lex_iv_ran_v_2; lex_iv_ran_v_2.fValue.f_float = (float)0.0;
    lex_iv_ran_v_2.fValue.f_floatType.f_floatEnum = XSValue::DoubleFloatType_NegINF;
    XSValue::XSValue_Data lex_iv_ran_v_3; lex_iv_ran_v_3.fValue.f_float = (float)0.0;
    lex_iv_ran_v_3.fValue.f_floatType.f_floatEnum = XSValue::DoubleFloatType_Zero;
    XSValue::XSValue_Data lex_iv_ran_v_4; lex_iv_ran_v_4.fValue.f_float = (float)0.0;
    lex_iv_ran_v_4.fValue.f_floatType.f_floatEnum = XSValue::DoubleFloatType_Zero;

    const char lex_v_ran_iv_1_canrep[]="INF";  // " 3.402823466E39"
    const char lex_v_ran_iv_2_canrep[]="-INF"; // "-3.402823466E39";
    const char lex_v_ran_iv_3_canrep[]="0";    // " 1.175494351E-46";
    const char lex_v_ran_iv_4_canrep[]="0";    // "-1.175494351E-46";

    const char lex_iv_1[]="12x.e+10";
    const char lex_iv_2[]="12.e+1x";

/***
 * 3.2.4.2 Canonical representation
 *
 * The canonical representation for float is defined by prohibiting certain options from the Lexical
 * representation (3.2.4.1).
 * Specifically,
 * 1. the exponent must be indicated by "E".
 * 2. Leading zeroes and the preceding optional "+" sign are prohibited in the exponent.
 * 3. For the mantissa, the preceding optional "+" sign is prohibited and the decimal point is required.
 *    Leading and trailing zeroes are prohibited subject to the following:
 *    number representations must be normalized such that there is a single digit to the left of the decimal point
 *    and at least a single digit to the right of the decimal point.
 *
 ***/

    const char data_rawstr_1[]="   -123.45    \n";
    const char data_canrep_1[]="-1.2345E2";
    const char data_rawstr_2[]="+123.45";
    const char data_canrep_2[]="1.2345E2";
    const char data_rawstr_3[]="+123.45e+0012";
    const char data_canrep_3[]="1.2345E14";
    const char data_rawstr_4[]="+100.000e2";
    const char data_canrep_4[]="1.0E4";
    const char data_rawstr_5[]="00100.23e2";
    const char data_canrep_5[]="1.0023E4";

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *    lexical valid
     *            range  valid                           true              n/a
     *            range  invalid                         false           st_FOCA0002
     *    lexical invalid                                false           st_FOCA0002
     *
     ***/

    // lexical valid, range valid
    VALIDATE_TEST(lex_v_ran_v_0 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_1 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_2 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_3 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_v_4 , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical valid, range invalid
    VALIDATE_TEST(lex_v_ran_iv_1 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_iv_2 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_iv_3 , dt, EXP_RET_VALID_TRUE, DONT_CARE);
    VALIDATE_TEST(lex_v_ran_iv_4 , dt, EXP_RET_VALID_TRUE, DONT_CARE);

    // lexical invalid
    VALIDATE_TEST(lex_iv_1         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(lex_iv_2         , dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XSValue         n/a
     *          range  invalid                              0            st_Unpresentable
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        // lexical valid, range valid
        ACTVALUE_TEST(lex_v_ran_v_0,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_0);
        ACTVALUE_TEST(lex_v_ran_v_1,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_v_2,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_v_3,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_3);
        ACTVALUE_TEST(lex_v_ran_v_4,  dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, act_v_ran_v_4);

        // lexical valid, range invalid
        ACTVALUE_TEST(lex_v_ran_iv_1, dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, lex_iv_ran_v_1);
        ACTVALUE_TEST(lex_v_ran_iv_2, dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, lex_iv_ran_v_2);
        ACTVALUE_TEST(lex_v_ran_iv_3, dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, lex_iv_ran_v_3);
        ACTVALUE_TEST(lex_v_ran_iv_4, dt, toValidate, EXP_RET_VALUE_TRUE, DONT_CARE, lex_iv_ran_v_4);

        // lexical invalid
        ACTVALUE_TEST(lex_iv_1      , dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);
        ACTVALUE_TEST(lex_iv_2      , dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_0);

    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                              0            st_FOCA0002
     *  lexical invalid                                     0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *  lexical valid
     *          range  valid                              XMLCh          n/a
     *          range  invalid                            XMLCh          n/a
     *  lexical invalid                                     0            st_FOCA0002
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        // lexical valid, range valid
        CANREP_TEST(data_rawstr_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_1,    DONT_CARE);
        CANREP_TEST(data_rawstr_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_2,    DONT_CARE);
        CANREP_TEST(data_rawstr_3,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_3,    DONT_CARE);
        CANREP_TEST(data_rawstr_4,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_4,    DONT_CARE);
        CANREP_TEST(data_rawstr_5,    dt, toValidate, EXP_RET_CANREP_TRUE,  data_canrep_5,    DONT_CARE);

        // lexical invalid
        CANREP_TEST(lex_iv_1,         dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);
        CANREP_TEST(lex_iv_2,         dt, toValidate, EXP_RET_CANREP_FALSE, null_string,      XSValue::st_FOCA0002);

        // lexical valid, range invalid (however XML4C ignores that)
        CANREP_TEST(lex_v_ran_iv_1,    dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_1_canrep,    DONT_CARE);
        CANREP_TEST(lex_v_ran_iv_2,    dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_2_canrep,    DONT_CARE);
        CANREP_TEST(lex_v_ran_iv_3,    dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_3_canrep,    DONT_CARE);
        CANREP_TEST(lex_v_ran_iv_4,    dt, toValidate, EXP_RET_CANREP_TRUE,  lex_v_ran_iv_4_canrep,    DONT_CARE);
    }
}